

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  TestCaseInfo *in_RDX;
  TestCaseInfo *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  byte in_R9B;
  
  *in_RDI = &PTR__TestCaseStats_0022b6c8;
  TestCaseInfo::TestCaseInfo(in_RSI,in_RDX);
  uVar1 = *(undefined8 *)in_RDX;
  uVar2 = *(undefined8 *)&in_RDX->field_0x8;
  uVar3 = *(undefined8 *)&in_RDX->field_0x10;
  uVar4 = *(undefined8 *)&in_RDX->field_0x18;
  uVar5 = *(undefined8 *)&in_RDX->field_0x28;
  in_RDI[0x27] = *(undefined8 *)&in_RDX->className;
  in_RDI[0x28] = uVar5;
  in_RDI[0x25] = uVar3;
  in_RDI[0x26] = uVar4;
  in_RDI[0x23] = uVar1;
  in_RDI[0x24] = uVar2;
  std::__cxx11::string::string
            ((string *)(in_RDI + 0x29),(string *)CONCAT71(in_register_00000009,in_CL));
  std::__cxx11::string::string((string *)(in_RDI + 0x2d),in_R8);
  *(byte *)(in_RDI + 0x31) = in_R9B & 1;
  return;
}

Assistant:

TestCaseStats(  TestCaseInfo const& _testInfo,
                        Totals const& _totals,
                        std::string const& _stdOut,
                        std::string const& _stdErr,
                        bool _aborting )
        : testInfo( _testInfo ),
            totals( _totals ),
            stdOut( _stdOut ),
            stdErr( _stdErr ),
            aborting( _aborting )
        {}